

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

void xmlRelaxNGSimplify(xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict cur,
                       xmlRelaxNGDefinePtr_conflict parent)

{
  xmlRelaxNGDefinePtr pxVar1;
  xmlRelaxNGDefinePtr_conflict def;
  int iVar2;
  bool bVar3;
  xmlRelaxNGDefinePtr_conflict local_40;
  xmlRelaxNGDefinePtr_conflict pre;
  xmlRelaxNGDefinePtr_conflict tmp;
  xmlRelaxNGDefinePtr_conflict pxStack_28;
  int attronly;
  xmlRelaxNGDefinePtr_conflict prev;
  xmlRelaxNGDefinePtr_conflict parent_local;
  xmlRelaxNGDefinePtr_conflict cur_local;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  pxStack_28 = (xmlRelaxNGDefinePtr_conflict)0x0;
  parent_local = cur;
  do {
    if (parent_local == (xmlRelaxNGDefinePtr_conflict)0x0) {
      return;
    }
    if ((parent_local->type == XML_RELAXNG_REF) || (parent_local->type == XML_RELAXNG_PARENTREF)) {
      if (parent_local->depth != -3) {
        parent_local->depth = -3;
        xmlRelaxNGSimplify(ctxt,parent_local->content,parent_local);
      }
    }
    else if (parent_local->type == XML_RELAXNG_NOT_ALLOWED) {
      parent_local->parent = parent;
      if ((parent != (xmlRelaxNGDefinePtr_conflict)0x0) &&
         (((((parent->type == XML_RELAXNG_ATTRIBUTE || (parent->type == XML_RELAXNG_LIST)) ||
            (parent->type == XML_RELAXNG_GROUP)) ||
           ((parent->type == XML_RELAXNG_INTERLEAVE || (parent->type == XML_RELAXNG_ONEORMORE)))) ||
          (parent->type == XML_RELAXNG_ZEROORMORE)))) {
        parent->type = XML_RELAXNG_NOT_ALLOWED;
        return;
      }
      if ((parent == (xmlRelaxNGDefinePtr_conflict)0x0) || (parent->type != XML_RELAXNG_CHOICE)) {
        pxStack_28 = parent_local;
      }
      else {
        pxStack_28 = xmlRelaxNGTryUnlink(ctxt,parent_local,parent,pxStack_28);
      }
    }
    else if (parent_local->type == XML_RELAXNG_EMPTY) {
      parent_local->parent = parent;
      if ((parent != (xmlRelaxNGDefinePtr_conflict)0x0) &&
         ((parent->type == XML_RELAXNG_ONEORMORE || (parent->type == XML_RELAXNG_ZEROORMORE)))) {
        parent->type = XML_RELAXNG_EMPTY;
        return;
      }
      if ((parent == (xmlRelaxNGDefinePtr_conflict)0x0) ||
         ((parent->type != XML_RELAXNG_GROUP && (parent->type != XML_RELAXNG_INTERLEAVE)))) {
        pxStack_28 = parent_local;
      }
      else {
        pxStack_28 = xmlRelaxNGTryUnlink(ctxt,parent_local,parent,pxStack_28);
      }
    }
    else {
      parent_local->parent = parent;
      if (parent_local->content != (xmlRelaxNGDefinePtr)0x0) {
        xmlRelaxNGSimplify(ctxt,parent_local->content,parent_local);
      }
      if ((parent_local->type != XML_RELAXNG_VALUE) &&
         (parent_local->attrs != (xmlRelaxNGDefinePtr)0x0)) {
        xmlRelaxNGSimplify(ctxt,parent_local->attrs,parent_local);
      }
      if (parent_local->nameClass != (xmlRelaxNGDefinePtr)0x0) {
        xmlRelaxNGSimplify(ctxt,parent_local->nameClass,parent_local);
      }
      if (parent_local->type == XML_RELAXNG_ELEMENT) {
        while ((parent_local->content != (xmlRelaxNGDefinePtr)0x0 &&
               (iVar2 = xmlRelaxNGGenerateAttributes(ctxt,parent_local->content), iVar2 == 1))) {
          pxVar1 = parent_local->content;
          parent_local->content = pxVar1->next;
          pxVar1->next = parent_local->attrs;
          parent_local->attrs = pxVar1;
        }
        def = parent_local->content;
        while( true ) {
          local_40 = def;
          bVar3 = false;
          if (local_40 != (xmlRelaxNGDefinePtr_conflict)0x0) {
            bVar3 = local_40->next != (xmlRelaxNGDefinePtr)0x0;
          }
          if (!bVar3) break;
          def = local_40->next;
          iVar2 = xmlRelaxNGGenerateAttributes(ctxt,def);
          if (iVar2 == 1) {
            local_40->next = def->next;
            def->next = parent_local->attrs;
            parent_local->attrs = def;
            def = local_40;
          }
        }
      }
      if ((parent_local->type == XML_RELAXNG_GROUP) ||
         (parent_local->type == XML_RELAXNG_INTERLEAVE)) {
        if (parent_local->content == (xmlRelaxNGDefinePtr)0x0) {
          parent_local->type = XML_RELAXNG_EMPTY;
        }
        else if (parent_local->content->next == (xmlRelaxNGDefinePtr)0x0) {
          if ((parent == (xmlRelaxNGDefinePtr_conflict)0x0) &&
             (pxStack_28 == (xmlRelaxNGDefinePtr_conflict)0x0)) {
            parent_local->type = XML_RELAXNG_NOOP;
          }
          else if (pxStack_28 == (xmlRelaxNGDefinePtr_conflict)0x0) {
            parent->content = parent_local->content;
            parent_local->content->next = parent_local->next;
            parent_local = parent_local->content;
          }
          else {
            parent_local->content->next = parent_local->next;
            pxStack_28->next = parent_local->content;
            parent_local = parent_local->content;
          }
        }
      }
      if (((parent_local->type == XML_RELAXNG_EXCEPT) &&
          (parent_local->content != (xmlRelaxNGDefinePtr)0x0)) &&
         (parent_local->content->type == XML_RELAXNG_NOT_ALLOWED)) {
        pxStack_28 = xmlRelaxNGTryUnlink(ctxt,parent_local,parent,pxStack_28);
      }
      else if (parent_local->type == XML_RELAXNG_NOT_ALLOWED) {
        if ((parent != (xmlRelaxNGDefinePtr_conflict)0x0) &&
           (((((parent->type == XML_RELAXNG_ATTRIBUTE || (parent->type == XML_RELAXNG_LIST)) ||
              (parent->type == XML_RELAXNG_GROUP)) ||
             ((parent->type == XML_RELAXNG_INTERLEAVE || (parent->type == XML_RELAXNG_ONEORMORE))))
            || (parent->type == XML_RELAXNG_ZEROORMORE)))) {
          parent->type = XML_RELAXNG_NOT_ALLOWED;
          return;
        }
        if ((parent == (xmlRelaxNGDefinePtr_conflict)0x0) || (parent->type != XML_RELAXNG_CHOICE)) {
          pxStack_28 = parent_local;
        }
        else {
          pxStack_28 = xmlRelaxNGTryUnlink(ctxt,parent_local,parent,pxStack_28);
        }
      }
      else if (parent_local->type == XML_RELAXNG_EMPTY) {
        if ((parent != (xmlRelaxNGDefinePtr_conflict)0x0) &&
           ((parent->type == XML_RELAXNG_ONEORMORE || (parent->type == XML_RELAXNG_ZEROORMORE)))) {
          parent->type = XML_RELAXNG_EMPTY;
          return;
        }
        if ((parent == (xmlRelaxNGDefinePtr_conflict)0x0) ||
           (((parent->type != XML_RELAXNG_GROUP && (parent->type != XML_RELAXNG_INTERLEAVE)) &&
            (parent->type != XML_RELAXNG_CHOICE)))) {
          pxStack_28 = parent_local;
        }
        else {
          pxStack_28 = xmlRelaxNGTryUnlink(ctxt,parent_local,parent,pxStack_28);
        }
      }
      else {
        pxStack_28 = parent_local;
      }
    }
    parent_local = parent_local->next;
  } while( true );
}

Assistant:

static void
xmlRelaxNGSimplify(xmlRelaxNGParserCtxtPtr ctxt,
                   xmlRelaxNGDefinePtr cur, xmlRelaxNGDefinePtr parent)
{
    xmlRelaxNGDefinePtr prev = NULL;

    while (cur != NULL) {
        if ((cur->type == XML_RELAXNG_REF) ||
            (cur->type == XML_RELAXNG_PARENTREF)) {
            if (cur->depth != -3) {
                cur->depth = -3;
                xmlRelaxNGSimplify(ctxt, cur->content, cur);
            }
        } else if (cur->type == XML_RELAXNG_NOT_ALLOWED) {
            cur->parent = parent;
            if ((parent != NULL) &&
                ((parent->type == XML_RELAXNG_ATTRIBUTE) ||
                 (parent->type == XML_RELAXNG_LIST) ||
                 (parent->type == XML_RELAXNG_GROUP) ||
                 (parent->type == XML_RELAXNG_INTERLEAVE) ||
                 (parent->type == XML_RELAXNG_ONEORMORE) ||
                 (parent->type == XML_RELAXNG_ZEROORMORE))) {
                parent->type = XML_RELAXNG_NOT_ALLOWED;
                break;
            }
            if ((parent != NULL) && (parent->type == XML_RELAXNG_CHOICE)) {
                prev = xmlRelaxNGTryUnlink(ctxt, cur, parent, prev);
            } else
                prev = cur;
        } else if (cur->type == XML_RELAXNG_EMPTY) {
            cur->parent = parent;
            if ((parent != NULL) &&
                ((parent->type == XML_RELAXNG_ONEORMORE) ||
                 (parent->type == XML_RELAXNG_ZEROORMORE))) {
                parent->type = XML_RELAXNG_EMPTY;
                break;
            }
            if ((parent != NULL) &&
                ((parent->type == XML_RELAXNG_GROUP) ||
                 (parent->type == XML_RELAXNG_INTERLEAVE))) {
                prev = xmlRelaxNGTryUnlink(ctxt, cur, parent, prev);
            } else
                prev = cur;
        } else {
            cur->parent = parent;
            if (cur->content != NULL)
                xmlRelaxNGSimplify(ctxt, cur->content, cur);
            if ((cur->type != XML_RELAXNG_VALUE) && (cur->attrs != NULL))
                xmlRelaxNGSimplify(ctxt, cur->attrs, cur);
            if (cur->nameClass != NULL)
                xmlRelaxNGSimplify(ctxt, cur->nameClass, cur);
            /*
             * On Elements, try to move attribute only generating rules on
             * the attrs rules.
             */
            if (cur->type == XML_RELAXNG_ELEMENT) {
                int attronly;
                xmlRelaxNGDefinePtr tmp, pre;

                while (cur->content != NULL) {
                    attronly =
                        xmlRelaxNGGenerateAttributes(ctxt, cur->content);
                    if (attronly == 1) {
                        /*
                         * migrate cur->content to attrs
                         */
                        tmp = cur->content;
                        cur->content = tmp->next;
                        tmp->next = cur->attrs;
                        cur->attrs = tmp;
                    } else {
                        /*
                         * cur->content can generate elements or text
                         */
                        break;
                    }
                }
                pre = cur->content;
                while ((pre != NULL) && (pre->next != NULL)) {
                    tmp = pre->next;
                    attronly = xmlRelaxNGGenerateAttributes(ctxt, tmp);
                    if (attronly == 1) {
                        /*
                         * migrate tmp to attrs
                         */
                        pre->next = tmp->next;
                        tmp->next = cur->attrs;
                        cur->attrs = tmp;
                    } else {
                        pre = tmp;
                    }
                }
            }
            /*
             * This may result in a simplification
             */
            if ((cur->type == XML_RELAXNG_GROUP) ||
                (cur->type == XML_RELAXNG_INTERLEAVE)) {
                if (cur->content == NULL)
                    cur->type = XML_RELAXNG_EMPTY;
                else if (cur->content->next == NULL) {
                    if ((parent == NULL) && (prev == NULL)) {
                        cur->type = XML_RELAXNG_NOOP;
                    } else if (prev == NULL) {
                        parent->content = cur->content;
                        cur->content->next = cur->next;
                        cur = cur->content;
                    } else {
                        cur->content->next = cur->next;
                        prev->next = cur->content;
                        cur = cur->content;
                    }
                }
            }
            /*
             * the current node may have been transformed back
             */
            if ((cur->type == XML_RELAXNG_EXCEPT) &&
                (cur->content != NULL) &&
                (cur->content->type == XML_RELAXNG_NOT_ALLOWED)) {
                prev = xmlRelaxNGTryUnlink(ctxt, cur, parent, prev);
            } else if (cur->type == XML_RELAXNG_NOT_ALLOWED) {
                if ((parent != NULL) &&
                    ((parent->type == XML_RELAXNG_ATTRIBUTE) ||
                     (parent->type == XML_RELAXNG_LIST) ||
                     (parent->type == XML_RELAXNG_GROUP) ||
                     (parent->type == XML_RELAXNG_INTERLEAVE) ||
                     (parent->type == XML_RELAXNG_ONEORMORE) ||
                     (parent->type == XML_RELAXNG_ZEROORMORE))) {
                    parent->type = XML_RELAXNG_NOT_ALLOWED;
                    break;
                }
                if ((parent != NULL) &&
                    (parent->type == XML_RELAXNG_CHOICE)) {
                    prev = xmlRelaxNGTryUnlink(ctxt, cur, parent, prev);
                } else
                    prev = cur;
            } else if (cur->type == XML_RELAXNG_EMPTY) {
                if ((parent != NULL) &&
                    ((parent->type == XML_RELAXNG_ONEORMORE) ||
                     (parent->type == XML_RELAXNG_ZEROORMORE))) {
                    parent->type = XML_RELAXNG_EMPTY;
                    break;
                }
                if ((parent != NULL) &&
                    ((parent->type == XML_RELAXNG_GROUP) ||
                     (parent->type == XML_RELAXNG_INTERLEAVE) ||
                     (parent->type == XML_RELAXNG_CHOICE))) {
                    prev = xmlRelaxNGTryUnlink(ctxt, cur, parent, prev);
                } else
                    prev = cur;
            } else {
                prev = cur;
            }
        }
        cur = cur->next;
    }
}